

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O0

void __thiscall SoapySDR::Device::setGain(Device *this,int dir,size_t channel,double gain)

{
  ulong uVar1;
  undefined8 uVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  double *pdVar6;
  undefined8 in_RDX;
  int in_ESI;
  long *in_RDI;
  double in_XMM0_Qa;
  double dVar7;
  double dVar8;
  double g_1;
  Range r_1;
  size_t i_1;
  double g;
  Range r;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe80;
  double local_a8;
  double local_a0;
  Range local_98;
  ulong local_80;
  double local_78;
  double local_70;
  Range local_58;
  int local_3c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  double local_20;
  undefined8 local_18;
  int local_c;
  
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  local_c = in_ESI;
  (**(code **)(*in_RDI + 0x150))(&local_38,in_RDI,in_ESI,in_RDX);
  if (local_c == 0) {
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_38);
    local_3c = (int)sVar4;
    while (iVar3 = local_c, uVar2 = local_18, local_3c = local_3c + -1, -1 < local_3c) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_38,(long)local_3c);
      (**(code **)(*in_RDI + 0x198))(&local_58,in_RDI,iVar3,uVar2,pvVar5);
      dVar7 = Range::maximum(&local_58);
      local_78 = Range::minimum(&local_58);
      local_78 = dVar7 - local_78;
      pdVar6 = std::min<double>(&local_20,&local_78);
      iVar3 = local_c;
      uVar2 = local_18;
      local_70 = *pdVar6;
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_38,(long)local_3c);
      dVar7 = local_70;
      dVar8 = Range::minimum(&local_58);
      (**(code **)(*in_RDI + 0x178))(dVar7 + dVar8,in_RDI,iVar3,uVar2,pvVar5);
      iVar3 = local_c;
      uVar2 = local_18;
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_38,(long)local_3c);
      dVar7 = (double)(**(code **)(*in_RDI + 0x188))(in_RDI,iVar3,uVar2,pvVar5);
      dVar8 = Range::minimum(&local_58);
      local_20 = local_20 - (dVar7 - dVar8);
    }
  }
  if (local_c == 1) {
    for (local_80 = 0; uVar1 = local_80,
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_38), iVar3 = local_c, uVar2 = local_18, uVar1 < sVar4;
        local_80 = local_80 + 1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_38,local_80);
      (**(code **)(*in_RDI + 0x198))(&local_98,in_RDI,iVar3,uVar2,pvVar5);
      dVar7 = Range::maximum(&local_98);
      local_a8 = Range::minimum(&local_98);
      local_a8 = dVar7 - local_a8;
      pdVar6 = std::min<double>(&local_20,&local_a8);
      iVar3 = local_c;
      uVar2 = local_18;
      local_a0 = *pdVar6;
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_38,local_80);
      dVar7 = local_a0;
      dVar8 = Range::minimum(&local_98);
      (**(code **)(*in_RDI + 0x178))(dVar7 + dVar8,in_RDI,iVar3,uVar2,pvVar5);
      iVar3 = local_c;
      uVar2 = local_18;
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_38,local_80);
      in_stack_fffffffffffffe80 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(**(code **)(*in_RDI + 0x188))(in_RDI,iVar3,uVar2,pvVar5);
      dVar7 = Range::minimum(&local_98);
      local_20 = local_20 - ((double)in_stack_fffffffffffffe80 - dVar7);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffe80);
  return;
}

Assistant:

void SoapySDR::Device::setGain(const int dir, const size_t channel, double gain)
{
    //algorithm to distribute overall gain (TX gets BB first, RX gets RF first)
    const auto names = this->listGains(dir, channel);
    if (dir == SOAPY_SDR_TX)
    {
        for (int i = names.size()-1; i >= 0; i--)
        {
            const auto r = this->getGainRange(dir, channel, names[i]);
            const double g = std::min(gain, r.maximum()-r.minimum());
            this->setGain(dir, channel, names[i], g+r.minimum());
            gain -= this->getGain(dir, channel, names[i])-r.minimum();
        }
    }
    if (dir == SOAPY_SDR_RX)
    {
        for (size_t i = 0; i < names.size(); i++)
        {
            const auto r = this->getGainRange(dir, channel, names[i]);
            const double g = std::min(gain, r.maximum()-r.minimum());
            this->setGain(dir, channel, names[i], g+r.minimum());
            gain -= this->getGain(dir, channel, names[i])-r.minimum();
        }
    }
}